

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O3

DdNode * Cudd_bddUnivAbstract(DdManager *manager,DdNode *f,DdNode *cube)

{
  DdNode *pDVar1;
  
  if (((ulong)cube & 1) == 0) {
    pDVar1 = cube;
    do {
      if (manager->one == pDVar1) {
        do {
          manager->reordered = 0;
          pDVar1 = cuddBddExistAbstractRecur(manager,(DdNode *)((ulong)f ^ 1),cube);
        } while (manager->reordered == 1);
        if (pDVar1 != (DdNode *)0x0) {
          return (DdNode *)((ulong)pDVar1 ^ 1);
        }
        return (DdNode *)0x0;
      }
    } while (((pDVar1->index != 0x7fffffff) &&
             ((pDVar1->type).kids.E == (DdNode *)((ulong)manager->one ^ 1))) &&
            (pDVar1 = (pDVar1->type).kids.T, ((ulong)pDVar1 & 1) == 0));
  }
  fwrite("Error: Can only abstract positive cubes\n",0x28,1,(FILE *)manager->err);
  manager->errorCode = CUDD_INVALID_ARG;
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_bddUnivAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode      *res;

    if (bddCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,
                       "Error: Can only abstract positive cubes\n");
        manager->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddBddExistAbstractRecur(manager, Cudd_Not(f), cube);
    } while (manager->reordered == 1);
    if (res != NULL) res = Cudd_Not(res);

    return(res);

}